

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O2

void swrenderer::R_AddSprites(sector_t_conflict *sec,int lightlevel,int fakeside)

{
  double *pdVar1;
  int iVar2;
  AActor *thing;
  extsector_t *peVar3;
  sector_t_conflict *psVar4;
  double *pdVar5;
  secplane_t *psVar6;
  PClass *pPVar7;
  sector_t_conflict *fakeceiling;
  sector_t_conflict *fakefloor;
  long lVar8;
  sector_t_conflict *in_R8;
  msecnode_t *pmVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  pmVar9 = sec->touching_renderthings;
  if ((pmVar9 != (msecnode_t *)0x0) && (sec->validcount != validcount)) {
    sec->validcount = validcount;
    spriteshade = (lightlevel + r_actualextralight) * -0x4000 + 0x3d0000;
    for (; pmVar9 != (msecnode_t *)0x0; pmVar9 = pmVar9->m_snext) {
      thing = pmVar9->m_thing;
      if (thing->validcount != validcount) {
        thing->validcount = validcount;
        pPVar7 = DObject::GetClass((DObject *)thing);
        lVar8 = *(long *)&pPVar7[1].super_PNativeStruct.super_PStruct.HasNativeFields;
        if (((lVar8 == 0) || (iVar2 = *(int *)(lVar8 + 0x28), iVar2 < 0)) ||
           (dVar10 = (thing->__Pos).X - ViewPos.X, dVar11 = (thing->__Pos).Y - ViewPos.Y,
           dVar12 = (thing->__Pos).Z - ViewPos.Z, dVar13 = (double)iVar2,
           dVar12 * dVar12 + dVar10 * dVar10 + dVar11 * dVar11 < dVar13 * dVar13)) {
          peVar3 = thing->Sector->e;
          fakefloor = (sector_t_conflict *)0x0;
          fakeceiling = (sector_t_conflict *)0x0;
          for (lVar8 = 0;
              (ulong)(peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count << 3 !=
              lVar8; lVar8 = lVar8 + 8) {
            psVar4 = *(sector_t_conflict **)
                      ((long)(peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array +
                      lVar8);
            if (((~*(uint *)&psVar4->planes[1].xform.xOffs & 0xb) == 0) &&
               (*(int *)((long)&psVar4->planes[1].xform.yScale + 4) == 0xff)) {
              if ((fakefloor == (sector_t_conflict *)0x0) &&
                 ((pdVar5 = (double *)psVar4->planes[0].xform.Angle.Degrees,
                  pdVar5[1] != 0.0 || *pdVar5 != 0.0 ||
                  (pdVar1 = &(thing->__Pos).Z, fakefloor = psVar4,
                  *pdVar1 <= pdVar5[4] * pdVar5[3] && pdVar5[4] * pdVar5[3] != *pdVar1)))) {
                fakefloor = (sector_t_conflict *)0x0;
              }
              psVar6 = (secplane_t *)psVar4->planes[0].xform.xOffs;
              if (((psVar6->normal).Y != 0.0 || (psVar6->normal).X != 0.0) ||
                 (psVar6->negiC * psVar6->D < thing->Height + (thing->__Pos).Z)) goto LAB_00314076;
            }
            else {
LAB_00314076:
              psVar4 = fakeceiling;
            }
            fakeceiling = psVar4;
            in_R8 = fakeceiling;
          }
          R_ProjectSprite(thing,fakeside,(F3DFloor *)fakefloor,(F3DFloor *)fakeceiling,in_R8);
        }
      }
    }
  }
  return;
}

Assistant:

void R_AddSprites (sector_t *sec, int lightlevel, int fakeside)
{
	F3DFloor *fakeceiling = NULL;
	F3DFloor *fakefloor = NULL;

	// BSP is traversed by subsector.
	// A sector might have been split into several
	//	subsectors during BSP building.
	// Thus we check whether it was already added.
	if (sec->touching_renderthings == nullptr || sec->validcount == validcount)
		return;

	// Well, now it will be done.
	sec->validcount = validcount;

	spriteshade = LIGHT2SHADE(lightlevel + r_actualextralight);

	// Handle all things in sector.
	for(auto p = sec->touching_renderthings; p != nullptr; p = p->m_snext)
	{
		auto thing = p->m_thing;
		if (thing->validcount == validcount) continue;
		thing->validcount = validcount;
		
		FIntCVar *cvar = thing->GetClass()->distancecheck;
		if (cvar != NULL && *cvar >= 0)
		{
			double dist = (thing->Pos() - ViewPos).LengthSquared();
			double check = (double)**cvar;
			if (dist >= check * check)
			{
				continue;
			}
		}

		// find fake level
		for(auto rover : thing->Sector->e->XFloor.ffloors) 
		{
			if(!(rover->flags & FF_EXISTS) || !(rover->flags & FF_RENDERPLANES)) continue;
			if(!(rover->flags & FF_SOLID) || rover->alpha != 255) continue;
			if(!fakefloor)
			{
				if(!rover->top.plane->isSlope())
				{
					if(rover->top.plane->ZatPoint(0., 0.) <= thing->Z()) fakefloor = rover;
				}
			}
			if(!rover->bottom.plane->isSlope())
			{
				if(rover->bottom.plane->ZatPoint(0., 0.) >= thing->Top()) fakeceiling = rover;
			}
		}	
		R_ProjectSprite (thing, fakeside, fakefloor, fakeceiling, sec);
		fakeceiling = NULL;
		fakefloor = NULL;
	}
}